

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcBeamType::IfcBeamType(IfcBeamType *this)

{
  IfcBeamType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcBeamType");
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__01070b70);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>,
             &PTR_construction_vtable_24__01070ca8);
  *(undefined8 *)this = 0x1070a40;
  *(undefined8 *)&this->field_0x1c0 = 0x1070b58;
  *(undefined8 *)&this->field_0x88 = 0x1070a68;
  *(undefined8 *)&this->field_0x98 = 0x1070a90;
  *(undefined8 *)&this->field_0xf0 = 0x1070ab8;
  *(undefined8 *)&this->field_0x148 = 0x1070ae0;
  *(undefined8 *)&this->field_0x180 = 0x1070b08;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x1070b30;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>).field_0x10);
  return;
}

Assistant:

IfcBeamType() : Object("IfcBeamType") {}